

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<long_double>_>::EqnBackward
          (TPZEqnArray<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *U,
          DecomposeType dec)

{
  ulong uVar1;
  longdouble lVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  complex<long_double> *pcVar7;
  complex<long_double> *pcVar8;
  long lVar9;
  long lVar10;
  complex<long_double> __r;
  longdouble local_88;
  longdouble local_7c;
  complex<long_double> local_58;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    uVar6 = (ulong)(uint)this->fNumEq;
    while (1 < (int)uVar6) {
      uVar1 = uVar6 - 2;
      piVar4 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar9 = (long)piVar4[uVar6 - 2];
      iVar3 = piVar4[uVar6 - 1];
      local_88 = (longdouble)0;
      lVar10 = lVar9;
      lVar5 = lVar9 * 0x20;
      local_7c = local_88;
      while( true ) {
        lVar10 = lVar10 + 1;
        if (iVar3 <= lVar10) break;
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar10],0);
        local_58._M_value._0_8_ = *(undefined8 *)pcVar7->_M_value;
        local_58._M_value._16_8_ = *(undefined8 *)(pcVar7->_M_value + 0x10);
        local_58._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 8),0);
        local_58._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 8) >> 0x10,0);
        local_58._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 0x18),0);
        local_58._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 0x18) >> 0x10,0);
        std::complex<long_double>::operator*=
                  (&local_58,
                   (complex<long_double> *)
                   ((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                    super_TPZVec<std::complex<long_double>_>.fStore[1]._M_value + lVar5));
        local_88 = local_88 - (longdouble)CONCAT28(local_58._M_value._8_2_,local_58._M_value._0_8_);
        local_7c = local_7c -
                   (longdouble)CONCAT28(local_58._M_value._24_2_,local_58._M_value._16_8_);
        lVar5 = lVar5 + 0x20;
      }
      pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar9],0);
      lVar2 = *(longdouble *)(pcVar7->_M_value + 0x10);
      *(longdouble *)pcVar7->_M_value = local_88 + *(longdouble *)pcVar7->_M_value;
      *(longdouble *)(pcVar7->_M_value + 0x10) = local_7c + lVar2;
      uVar6 = uVar1;
      if ((dec & ~ELUPivot) == ELU) {
        pcVar7 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                 super_TPZVec<std::complex<long_double>_>.fStore;
        pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<long_double>::operator/=(pcVar8,pcVar7 + lVar9);
      }
    }
  }
  else if (this->fSymmetric == EIsSymmetric) {
    uVar6 = (ulong)(uint)this->fNumEq;
    while (0 < (int)uVar6) {
      uVar1 = uVar6 - 1;
      piVar4 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar9 = (long)piVar4[uVar6 - 1];
      iVar3 = piVar4[uVar6];
      local_88 = (longdouble)0;
      lVar10 = lVar9;
      lVar5 = lVar9 * 0x20;
      local_7c = local_88;
      while( true ) {
        lVar10 = lVar10 + 1;
        if (iVar3 <= lVar10) break;
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar10],0);
        local_58._M_value._0_8_ = *(undefined8 *)pcVar7->_M_value;
        local_58._M_value._16_8_ = *(undefined8 *)(pcVar7->_M_value + 0x10);
        local_58._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 8),0);
        local_58._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 8) >> 0x10,0);
        local_58._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 0x18),0);
        local_58._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 0x18) >> 0x10,0);
        std::complex<long_double>::operator*=
                  (&local_58,
                   (complex<long_double> *)
                   ((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                    super_TPZVec<std::complex<long_double>_>.fStore[1]._M_value + lVar5));
        local_7c = local_7c - (longdouble)CONCAT28(local_58._M_value._8_2_,local_58._M_value._0_8_);
        local_88 = local_88 -
                   (longdouble)CONCAT28(local_58._M_value._24_2_,local_58._M_value._16_8_);
        lVar5 = lVar5 + 0x20;
      }
      pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar9],0);
      lVar2 = *(longdouble *)(pcVar7->_M_value + 0x10);
      *(longdouble *)pcVar7->_M_value = local_7c + *(longdouble *)pcVar7->_M_value;
      *(longdouble *)(pcVar7->_M_value + 0x10) = local_88 + lVar2;
      uVar6 = uVar1;
      if (dec == ECholesky) {
        pcVar7 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                 super_TPZVec<std::complex<long_double>_>.fStore;
        pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<long_double>::operator/=(pcVar8,pcVar7 + lVar9);
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}